

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaAigerExt.c
# Opt level: O2

Vec_Str_t * Gia_WritePacking(Vec_Int_t *vPacking)

{
  int Value;
  uchar *pArray;
  Vec_Str_t *pVVar1;
  int i;
  uchar *pPos;
  ulong uVar2;
  
  uVar2 = (ulong)vPacking->nSize;
  pArray = (uchar *)malloc(uVar2 << 2);
  pPos = pArray;
  for (i = 0; i < (int)uVar2; i = i + 1) {
    Value = Vec_IntEntry(vPacking,i);
    Gia_AigerWriteInt(pPos,Value);
    uVar2 = (ulong)(uint)vPacking->nSize;
    pPos = pPos + 4;
  }
  pVVar1 = Vec_StrAllocArray((char *)pArray,(int)uVar2 << 2);
  return pVVar1;
}

Assistant:

Vec_Str_t * Gia_WritePacking( Vec_Int_t * vPacking )
{
    unsigned char * pBuffer = ABC_ALLOC( unsigned char, 4*Vec_IntSize(vPacking) );
    int i, Entry, nSize = 0;
    Vec_IntForEachEntry( vPacking, Entry, i )
        Gia_AigerWriteInt( pBuffer + 4 * nSize++, Entry );
    return Vec_StrAllocArray( (char *)pBuffer, 4*Vec_IntSize(vPacking) );
}